

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::
get_interpolated_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_> local_c0;
  undefined1 local_a0 [8];
  optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_> pv_1;
  optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_> local_78;
  undefined1 local_58 [8];
  optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_> pv;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00778bb6;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 0x10),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 0x10));
  if (bVar1) {
    get_default_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
              (&local_78,this);
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::
    optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>,_0>
              ((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                *)local_58,&local_78);
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::~optional
              (&local_78);
    pv_1.contained._20_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_58);
    if ((bool)pv_1.contained._20_1_) {
      pvVar2 = nonstd::optional_lite::
               optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
               ::value((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                        *)local_58);
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::operator=
                (v,pvVar2);
      this_local._7_1_ = 1;
    }
    pv_1.contained._21_3_ = 0;
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::~optional
              ((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                *)local_58);
    if (pv_1.contained._20_4_ != 0) goto LAB_00778bb6;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00778bb6;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::
         get<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                (&local_c0,this);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::
      optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>,_0>
                ((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                  *)local_a0,&local_c0);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::
      ~optional(&local_c0);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_a0);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::
                 optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                 ::value((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                          *)local_a0);
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::operator=
                  (v,pvVar2);
        this_local._7_1_ = 1;
      }
      pv_1.contained._21_3_ = 0;
      pv_1.contained._20_1_ = bVar1;
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>::
      ~optional((optional<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                 *)local_a0);
      if (pv_1.contained._20_4_ != 0) goto LAB_00778bb6;
    }
    this_local._7_1_ = 0;
  }
LAB_00778bb6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }